

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_4,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  float *pfVar2;
  bool bVar3;
  Vector<float,_4> *pVVar4;
  int row;
  long lVar5;
  float v;
  float fVar6;
  float local_5c [5];
  Type in1;
  Type in0;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data[0] = (evalCtx->coords).m_data[0];
    in0.m_data[1] = (evalCtx->coords).m_data[1];
    in0.m_data[2] = (evalCtx->coords).m_data[2];
    in0.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    in0.m_data[0] = (float)0x3fb33333;
    in0.m_data[1] = (float)0x3e4ccccd;
    in0.m_data[2] = (float)0xbf000000;
    in0.m_data[3] = (float)0x3f333333;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in1.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    in1.m_data.m_data[0].m_data[0] = -1.2;
    in1.m_data.m_data[0].m_data[1] = 0.7;
    in1.m_data.m_data[0].m_data[2] = 0.7;
    in1.m_data.m_data[0].m_data[3] = -0.4;
    in1.m_data.m_data[1].m_data[0] = -1.0;
    in1.m_data.m_data[1].m_data[1] = -1.0;
    in1.m_data.m_data[1].m_data[2] = 0.7;
    in1.m_data.m_data[1].m_data[3] = -0.3;
  }
  local_5c[1] = 0.0;
  local_5c[0] = 0.0;
  pfVar2 = local_5c + 1;
  pVVar4 = (Vector<float,_4> *)&in1;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    fVar6 = 0.0;
    lVar5 = 0;
    do {
      fVar6 = fVar6 + pVVar4->m_data[lVar5] * in0.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    *pfVar2 = fVar6;
    pfVar2 = local_5c;
    pVVar4 = in1.m_data.m_data + 1;
    bVar1 = false;
  } while (bVar3);
  local_5c[2] = local_5c[1];
  local_5c[3] = local_5c[0];
  local_5c[4] = local_5c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = local_5c[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}